

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::AllocateObjectSynchData
          (CPalSynchronizationManager *this,CObjectType *potObjectType,ObjectDomain odObjectDomain,
          VOID **ppvSynchData)

{
  CPalThread *pthrCurrent_00;
  VOID *shmptr;
  SHMPTR shridSynchData;
  CPalThread *pthrCurrent;
  CSynchData *psdSynchData;
  PAL_ERROR palErr;
  VOID **ppvSynchData_local;
  ObjectDomain odObjectDomain_local;
  CObjectType *potObjectType_local;
  CPalSynchronizationManager *this_local;
  
  pthrCurrent_00 = InternalGetCurrentThread();
  if (odObjectDomain == SharedObject) {
    shmptr = (VOID *)CSHRSynchCache<CorUnix::CSynchData>::Get
                               (&this->m_cacheSHRSynchData,pthrCurrent_00);
    if (shmptr == (VOID *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return 8;
      }
      abort();
    }
    pthrCurrent = (CPalThread *)SHMPtrToPtr((SHMPTR)shmptr);
    if (pthrCurrent == (CPalThread *)0x0) {
      fprintf(_stderr,"] %s %s:%d","AllocateObjectSynchData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
              ,0x416);
      fprintf(_stderr,"Expression: NULL != psdSynchData, Description: Bad shared memory pointer\n");
    }
    CSynchData::SetWTLHeadShrPtr((CSynchData *)pthrCurrent,0);
    CSynchData::SetWTLTailShrPtr((CSynchData *)pthrCurrent,0);
    CSynchData::SetSharedThis((CSynchData *)pthrCurrent,(SHMPTR)shmptr);
    *ppvSynchData = shmptr;
  }
  else {
    pthrCurrent = (CPalThread *)
                  CSynchCache<CorUnix::CSynchData>::Get(&this->m_cacheSynchData,pthrCurrent_00);
    if (pthrCurrent == (CPalThread *)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
        return 8;
      }
      abort();
    }
    CSynchData::SetWTLHeadPtr((CSynchData *)pthrCurrent,(WaitingThreadsListNode *)0x0);
    CSynchData::SetWTLTailPtr((CSynchData *)pthrCurrent,(WaitingThreadsListNode *)0x0);
    CSynchData::SetSharedThis((CSynchData *)pthrCurrent,0);
    *ppvSynchData = pthrCurrent;
  }
  CSynchData::SetObjectDomain((CSynchData *)pthrCurrent,odObjectDomain);
  CSynchData::SetObjectType((CSynchData *)pthrCurrent,potObjectType);
  return 0;
}

Assistant:

PAL_ERROR CPalSynchronizationManager::AllocateObjectSynchData(
        CObjectType *potObjectType,
        ObjectDomain odObjectDomain,
        VOID **ppvSynchData)
    {
        PAL_ERROR palErr = NO_ERROR;
        CSynchData * psdSynchData = NULL;
        CPalThread * pthrCurrent = InternalGetCurrentThread();

        if (SharedObject == odObjectDomain)
        {
            SharedID shridSynchData = m_cacheSHRSynchData.Get(pthrCurrent);
            if (NULLSharedID == shridSynchData)
            {
                ERROR("Unable to allocate shared memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }
            psdSynchData = SharedIDToTypePointer(CSynchData, shridSynchData);

            VALIDATEOBJECT(psdSynchData);

            _ASSERT_MSG(NULL != psdSynchData, "Bad shared memory pointer\n");

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadShrPtr(NULLSharedID);
            psdSynchData->SetWTLTailShrPtr(NULLSharedID);

            // Store shared pointer to this object
            psdSynchData->SetSharedThis(shridSynchData);

            *ppvSynchData = reinterpret_cast<void *>(shridSynchData);
        }
        else
        {
            psdSynchData = m_cacheSynchData.Get(pthrCurrent);
            if (NULL == psdSynchData)
            {
                ERROR("Unable to allocate memory\n");
                palErr = ERROR_NOT_ENOUGH_MEMORY;
                goto AOSD_exit;
            }

            // Initialize waiting list pointers
            psdSynchData->SetWTLHeadPtr(NULL);
            psdSynchData->SetWTLTailPtr(NULL);

            // Set shared this pointer to NULL
            psdSynchData->SetSharedThis(NULLSharedID);

            *ppvSynchData = static_cast<void *>(psdSynchData);
        }

        // Initialize object domain and object type;
        psdSynchData->SetObjectDomain(odObjectDomain);
        psdSynchData->SetObjectType(potObjectType);

    AOSD_exit:
        return palErr;
    }